

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall Game::Update(Game *this)

{
  Snake *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  Snake local_a8;
  Snake local_68;
  
  if (((this->snake).alive == true) && ((this->snake2).alive == true)) {
    this_00 = &this->snake2;
    local_68.head_x = (this->snake2).head_x;
    local_68.head_y = (this->snake2).head_y;
    local_68.direction = this_00->direction;
    local_68.speed = this_00->speed;
    local_68.size = (this->snake2).size;
    local_68.alive = (this->snake2).alive;
    local_68._13_3_ = *(undefined3 *)&(this->snake2).field_0xd;
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::vector(&local_68.body,&(this->snake2).body);
    local_68.grid_height = (this->snake2).grid_height;
    local_68.growing = (this->snake2).growing;
    local_68._49_3_ = *(undefined3 *)&(this->snake2).field_0x31;
    local_68.grid_width = (this->snake2).grid_width;
    Snake::Update(&this->snake,&local_68);
    if (local_68.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_a8.head_x = (this->snake).head_x;
    local_a8.head_y = (this->snake).head_y;
    local_a8.direction = (this->snake).direction;
    local_a8.speed = (this->snake).speed;
    local_a8.size = (this->snake).size;
    local_a8.alive = (this->snake).alive;
    local_a8._13_3_ = *(undefined3 *)&(this->snake).field_0xd;
    std::vector<SDL_Point,_std::allocator<SDL_Point>_>::vector(&local_a8.body,&(this->snake).body);
    local_a8.grid_height = (this->snake).grid_height;
    local_a8.growing = (this->snake).growing;
    local_a8._49_3_ = *(undefined3 *)&(this->snake).field_0x31;
    local_a8.grid_width = (this->snake).grid_width;
    Snake::Update(this_00,&local_a8);
    if (local_a8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar4 = (int)(this->snake).head_x;
    uVar1 = (this->snake2).head_x;
    uVar2 = (this->snake2).head_y;
    iVar3 = (this->food).x;
    if ((iVar3 == iVar4) && (iVar3 = iVar4, (this->food).y == (int)(this->snake).head_y)) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(&this->snake);
      (this->snake).speed = (this->snake).speed + 0.02;
      iVar3 = (this->food).x;
    }
    iVar4 = (this->food).y;
    auVar5._0_4_ = -(uint)((int)(float)uVar1 == iVar3);
    auVar5._4_4_ = -(uint)((int)(float)uVar1 == iVar3);
    auVar5._8_4_ = -(uint)((int)(float)uVar2 == iVar4);
    auVar5._12_4_ = -(uint)((int)(float)uVar2 == iVar4);
    iVar3 = movmskpd(iVar3,auVar5);
    if (iVar3 == 3) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(this_00);
      (this->snake2).speed = (this->snake2).speed + 0.02;
    }
  }
  return;
}

Assistant:

void Game::Update() {
  if (!snake.alive || !snake2.alive) return;


  snake.Update(snake2);
  snake2.Update(snake);


  int new_x = static_cast<int>(snake.head_x);
  int new_y = static_cast<int>(snake.head_y);

  int new_x_player2 = static_cast<int>(snake2.head_x);
  int new_y_player2 = static_cast<int>(snake2.head_y);
  
  // Check if there's food over here
  if (food.x == new_x && food.y == new_y) {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake.GrowBody();
    snake.speed += 0.02;
  }
  
  if(food.x == new_x_player2 && food.y == new_y_player2)
  {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake2.GrowBody();
    snake2.speed += 0.02; 
  }
  
}